

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TracingServiceState_TracingSession::Serialize
          (TracingServiceState_TracingSession *this,Message *msg)

{
  bool bVar1;
  reference puVar2;
  void *data;
  size_t size;
  uint *it;
  const_iterator __end2;
  const_iterator __begin2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__range2;
  Message *msg_local;
  TracingServiceState_TracingSession *this_local;
  
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,1);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_long>(msg,1,this->id_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,2);
  if (bVar1) {
    protozero::Message::AppendVarInt<int>(msg,2,this->consumer_uid_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,3);
  if (bVar1) {
    protozero::Message::AppendString(msg,3,&this->state_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,4);
  if (bVar1) {
    protozero::Message::AppendString(msg,4,&this->unique_session_name_);
  }
  __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->buffer_size_kb_);
  it = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->buffer_size_kb_)
  ;
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                     *)&it), bVar1) {
    puVar2 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&__end2);
    protozero::Message::AppendVarInt<unsigned_int>(msg,5,*puVar2);
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&__end2);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,6);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,6,this->duration_ms_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,7);
  if (bVar1) {
    protozero::Message::AppendVarInt<unsigned_int>(msg,7,this->num_data_sources_);
  }
  bVar1 = std::bitset<9UL>::operator[](&this->_has_field_,8);
  if (bVar1) {
    protozero::Message::AppendVarInt<long>(msg,8,this->start_realtime_ns_);
  }
  data = (void *)::std::__cxx11::string::data();
  size = ::std::__cxx11::string::size();
  protozero::Message::AppendRawProtoBytes(msg,data,size);
  return;
}

Assistant:

void TracingServiceState_TracingSession::Serialize(::protozero::Message* msg) const {
  // Field 1: id
  if (_has_field_[1]) {
    msg->AppendVarInt(1, id_);
  }

  // Field 2: consumer_uid
  if (_has_field_[2]) {
    msg->AppendVarInt(2, consumer_uid_);
  }

  // Field 3: state
  if (_has_field_[3]) {
    msg->AppendString(3, state_);
  }

  // Field 4: unique_session_name
  if (_has_field_[4]) {
    msg->AppendString(4, unique_session_name_);
  }

  // Field 5: buffer_size_kb
  for (auto& it : buffer_size_kb_) {
    msg->AppendVarInt(5, it);
  }

  // Field 6: duration_ms
  if (_has_field_[6]) {
    msg->AppendVarInt(6, duration_ms_);
  }

  // Field 7: num_data_sources
  if (_has_field_[7]) {
    msg->AppendVarInt(7, num_data_sources_);
  }

  // Field 8: start_realtime_ns
  if (_has_field_[8]) {
    msg->AppendVarInt(8, start_realtime_ns_);
  }

  msg->AppendRawProtoBytes(unknown_fields_.data(), unknown_fields_.size());
}